

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdSplitSchnorrSignature(void *handle,char *signature,char **nonce,char **key)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  string sStack_a8;
  SchnorrSignature sig;
  char *work_nonce;
  Privkey local_58;
  undefined8 local_38;
  
  local_38 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x35f;
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"signature is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sig,"Failed to parameter. signature is null or empty.",
               (allocator *)&sStack_a8);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&sig);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (nonce != (char **)0x0) {
    if (key != (char **)0x0) {
      std::__cxx11::string::string((string *)&sStack_a8,signature,(allocator *)&local_58);
      cfd::core::SchnorrSignature::SchnorrSignature(&sig,&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      cfd::core::SchnorrSignature::GetNonce((SchnorrPubkey *)&local_58,&sig);
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&sStack_a8,(SchnorrPubkey *)&local_58);
      pcVar2 = cfd::capi::CreateString(&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
      cfd::core::SchnorrSignature::GetPrivkey(&local_58,&sig);
      cfd::core::Privkey::GetHex_abi_cxx11_(&sStack_a8,&local_58);
      pcVar3 = cfd::capi::CreateString(&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
      *nonce = pcVar2;
      *key = pcVar3;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
      return 0;
    }
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x36b;
    sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"key is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sig,"Failed to parameter. key is null.",(allocator *)&sStack_a8);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&sig);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x365;
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"nonce is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sig,"Failed to parameter. nonce is null.",(allocator *)&sStack_a8);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&sig);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSplitSchnorrSignature(
    void* handle, const char* signature, char** nonce, char** key) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_nonce = nullptr;
  char* work_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null.");
    }
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }

    SchnorrSignature sig = SchnorrSignature(std::string(signature));
    work_nonce = CreateString(sig.GetNonce().GetHex());
    work_key = CreateString(sig.GetPrivkey().GetHex());

    *nonce = work_nonce;
    *key = work_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_nonce, &work_key);
  return result;
}